

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::DOMLSParserImpl::canSetParameter(DOMLSParserImpl *this,XMLCh *name,void *param_2)

{
  int iVar1;
  void *param_2_local;
  XMLCh *name_local;
  DOMLSParserImpl *this_local;
  
  iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMResourceResolver);
  if ((((((iVar1 != 0) &&
         (iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMErrorHandler),
         iVar1 != 0)) &&
        (iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesEntityResolver),
        iVar1 != 0)) &&
       ((iVar1 = XMLString::compareIStringASCII
                           (name,(XMLCh *)XMLUni::fgXercesSchemaExternalSchemaLocation), iVar1 != 0
        && (iVar1 = XMLString::compareIStringASCII
                              (name,(XMLCh *)XMLUni::fgXercesSchemaExternalNoNameSpaceSchemaLocation
                              ), iVar1 != 0)))) &&
      ((iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesSecurityManager),
       iVar1 != 0 &&
       ((iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesScannerName),
        iVar1 != 0 &&
        (iVar1 = XMLString::compareIStringASCII
                           (name,(XMLCh *)XMLUni::fgXercesParserUseDocumentFromImplementation),
        iVar1 != 0)))))) &&
     (iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgXercesLowWaterMark), iVar1 != 0
     )) {
    iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMSchemaLocation);
    if ((iVar1 != 0) &&
       (iVar1 = XMLString::compareIStringASCII(name,(XMLCh *)XMLUni::fgDOMSchemaType), iVar1 != 0))
    {
      return false;
    }
    return false;
  }
  return true;
}

Assistant:

bool DOMLSParserImpl::canSetParameter(const XMLCh* name, const void* /*value*/) const
{
    if (XMLString::compareIStringASCII(name, XMLUni::fgDOMResourceResolver) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgDOMErrorHandler) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesEntityResolver) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesSchemaExternalSchemaLocation) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesSchemaExternalNoNameSpaceSchemaLocation) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesSecurityManager) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesScannerName) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesParserUseDocumentFromImplementation) == 0 ||
        XMLString::compareIStringASCII(name, XMLUni::fgXercesLowWaterMark) == 0)
      return true;
    else if(XMLString::compareIStringASCII(name, XMLUni::fgDOMSchemaLocation) == 0 ||
            XMLString::compareIStringASCII(name, XMLUni::fgDOMSchemaType) == 0)
      return false;

    return false;
}